

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deSharedPtr.hpp
# Opt level: O0

void __thiscall
de::SharedPtr<vkt::pipeline::TestTexture2DArray>::SharedPtr
          (SharedPtr<vkt::pipeline::TestTexture2DArray> *this,TestTexture2DArray *ptr)

{
  TestTexture2DArray *pTVar1;
  SharedPtrState<vkt::pipeline::TestTexture2DArray,_de::DefaultDeleter<vkt::pipeline::TestTexture2DArray>_>
  *pSVar2;
  DefaultDeleter<vkt::pipeline::TestTexture2DArray> local_25 [13];
  TestTexture2DArray *local_18;
  TestTexture2DArray *ptr_local;
  SharedPtr<vkt::pipeline::TestTexture2DArray> *this_local;
  
  this->m_ptr = (TestTexture2DArray *)0x0;
  this->m_state = (SharedPtrStateBase *)0x0;
  this->m_ptr = ptr;
  local_18 = ptr;
  ptr_local = (TestTexture2DArray *)this;
  pSVar2 = (SharedPtrState<vkt::pipeline::TestTexture2DArray,_de::DefaultDeleter<vkt::pipeline::TestTexture2DArray>_>
            *)operator_new(0x20);
  pTVar1 = local_18;
  DefaultDeleter<vkt::pipeline::TestTexture2DArray>::DefaultDeleter(local_25);
  SharedPtrState<vkt::pipeline::TestTexture2DArray,_de::DefaultDeleter<vkt::pipeline::TestTexture2DArray>_>
  ::SharedPtrState(pSVar2,pTVar1);
  this->m_state = (SharedPtrStateBase *)pSVar2;
  this->m_state->strongRefCount = 1;
  this->m_state->weakRefCount = 1;
  return;
}

Assistant:

inline SharedPtr<T>::SharedPtr (T* ptr)
	: m_ptr		(DE_NULL)
	, m_state	(DE_NULL)
{
	try
	{
		m_ptr	= ptr;
		m_state	= new SharedPtrState<T, DefaultDeleter<T> >(ptr, DefaultDeleter<T>());
		m_state->strongRefCount	= 1;
		m_state->weakRefCount	= 1;
	}
	catch (...)
	{
		// \note ptr is not released.
		delete m_state;
		throw;
	}
}